

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

int Cudd_ShortestLength(DdManager *manager,DdNode *f,int *weight)

{
  int iVar1;
  char *in_RAX;
  st__table *visited;
  cuddPathPair *my_pair;
  char *local_28;
  
  one = manager->one;
  zero = manager->zero;
  iVar1 = 1000000;
  if (zero != f && (DdNode *)((ulong)one ^ 1) != f) {
    local_28 = in_RAX;
    visited = st__init_table(st__ptrcmp,st__ptrhash);
    getShortest(f,weight,(int *)0x0,visited);
    iVar1 = st__lookup(visited,(char *)((ulong)f & 0xfffffffffffffffe),&local_28);
    if (iVar1 == 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = *(int *)(local_28 + (ulong)((uint)f & 1) * 4);
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    }
  }
  return iVar1;
}

Assistant:

int
Cudd_ShortestLength(
  DdManager * manager,
  DdNode * f,
  int * weight)
{
    register    DdNode  *F;
    st__table    *visited;
    cuddPathPair *my_pair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        return(DD_BIGGY);
    }

    /* From this point on, a path exists. */
    /* Initialize visited table and support. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);

    /* Now get the length of the shortest path(s) from f to 1. */
    (void) getShortest(f, weight, NULL, visited);

    complement = Cudd_IsComplement(f);

    F = Cudd_Regular(f);

    if (! st__lookup(visited, (const char *)F, (char **)&my_pair)) return(CUDD_OUT_OF_MEM);
    
    if (complement) {
        cost = my_pair->neg;
    } else {
        cost = my_pair->pos;
    }

    st__foreach(visited, freePathPair, NULL);
    st__free_table(visited);

    return(cost);

}